

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transpile_to_js.c
# Opt level: O2

void to_js_print_externs(FILE *out,Program *program,Command_Arguments *command_arguments)

{
  fwrite("\n/*EXTERNS START*/\n",0x13,1,(FILE *)out);
  Map_Map_Extended(&program->external_linkage->ids,_to_js_print_externs,command_arguments);
  fwrite("\n/*EXTERNS END*/\n",0x11,1,(FILE *)out);
  return;
}

Assistant:

void _to_js_print_externs(void *denoted,void *args)
{
#define ARGS(x) ((struct Command_Arguments*)x)
#define DENOTED(x) ((struct Denoted*)x)
#define DFUNC(x) ((struct Denoted_Function*)x)
#define DOBJ(x) ((struct Denoted_Object*)x)
	if(DENOTED(denoted)->denotation==DT_Function)
	{
		if(DFUNC(denoted)->body==NULL)
		{
			fprintf(ARGS(args)->output_file,"/*UNDEFINED*/");
		}
		fprintf(ARGS(args)->output_file,"var ");
		print_token(ARGS(args)->output_file,DFUNC(denoted)->id);
		fprintf(ARGS(args)->output_file,";");
		fprintf(ARGS(args)->output_file,"\n");

	}else if(DENOTED(denoted)->denotation==DT_Object)
	{
		fprintf(ARGS(args)->output_file,"var ");
		print_token(ARGS(args)->output_file,DFUNC(denoted)->id);
		fprintf(ARGS(args)->output_file,";\n");
	}

#undef DOBJ
#undef DFUNC
#undef ARGS
#undef DENOTED
}